

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O1

bool __thiscall
cmQtAutoGenGlobalInitializer::GetExecutableTestOutput
          (cmQtAutoGenGlobalInitializer *this,string *generator,string *executable,string *error,
          string *output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string *text;
  bool bVar3;
  iterator iVar4;
  long *plVar5;
  size_type *psVar6;
  string stdOut;
  string stdErr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  int retVal;
  string local_e0;
  string local_c0;
  string *local_a0;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  int local_54;
  string local_50;
  
  local_a0 = executable;
  iVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->ExecutableTestOutputs_)._M_h,executable);
  if (output != (string *)0x0 &&
      iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::__cxx11::string::_M_assign((string *)output);
  }
  text = local_a0;
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    return true;
  }
  bVar3 = cmsys::SystemTools::FileExists(local_a0,true);
  if (!bVar3) {
    std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x4bd906);
    std::__cxx11::string::_M_append((char *)error,(ulong)(generator->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)error);
    cmQtAutoGen::Quoted(&local_c0,text);
    std::__cxx11::string::_M_append((char *)error,(ulong)local_c0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::string::append((char *)error);
    return false;
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_78,text);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
             (char (*) [3])"-h");
  local_54 = 0;
  bVar3 = cmSystemTools::RunSingleCommand
                    (&local_78,&local_c0,&local_98,&local_54,(char *)0x0,OUTPUT_NONE,(cmDuration)0x0
                     ,Auto);
  if (bVar3) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,
                      CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                               local_98.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x4d14ff);
    std::__cxx11::string::_M_append((char *)error,(ulong)(generator->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)error);
    cmQtAutoGen::Quoted(&local_50,local_a0);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    paVar2 = &local_e0.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_e0.field_2._M_allocated_capacity = *psVar6;
      local_e0.field_2._8_8_ = plVar5[3];
      local_e0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar6;
      local_e0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_e0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)error,(ulong)local_e0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    cmQtAutoGen::QuotedCommand(&local_e0,&local_78);
    std::__cxx11::string::_M_append((char *)error,(ulong)local_e0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)error);
    std::__cxx11::string::_M_append((char *)error,(ulong)local_c0._M_dataplus._M_p);
    std::__cxx11::string::append((char *)error);
    std::__cxx11::string::_M_append((char *)error,(ulong)local_98._M_dataplus._M_p);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,
                      CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                               local_98.field_2._M_local_buf[0]) + 1);
    }
    if (!bVar3) goto LAB_00348d90;
  }
  if (output != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)output);
  }
  bVar3 = true;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::__cxx11::string_const&,std::__cxx11::string>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->ExecutableTestOutputs_,local_a0,&local_c0);
LAB_00348d90:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

bool cmQtAutoGenGlobalInitializer::GetExecutableTestOutput(
  std::string const& generator, std::string const& executable,
  std::string& error, std::string* output)
{
  // Check if we have cached output
  {
    auto it = this->ExecutableTestOutputs_.find(executable);
    if (it != this->ExecutableTestOutputs_.end()) {
      // Return output on demand
      if (output != nullptr) {
        *output = it->second;
      }
      return true;
    }
  }

  // Check if the executable exists
  if (!cmSystemTools::FileExists(executable, true)) {
    error = "The \"";
    error += generator;
    error += "\" executable ";
    error += cmQtAutoGen::Quoted(executable);
    error += " does not exist.";
    return false;
  }

  // Test the executable
  std::string stdOut;
  {
    std::string stdErr;
    std::vector<std::string> command;
    command.push_back(executable);
    command.emplace_back("-h");
    int retVal = 0;
    const bool runResult = cmSystemTools::RunSingleCommand(
      command, &stdOut, &stdErr, &retVal, nullptr, cmSystemTools::OUTPUT_NONE,
      cmDuration::zero(), cmProcessOutput::Auto);
    if (!runResult) {
      error = "Test run of \"";
      error += generator;
      error += "\" executable ";
      error += cmQtAutoGen::Quoted(executable) + " failed.\n";
      error += cmQtAutoGen::QuotedCommand(command);
      error += "\n";
      error += stdOut;
      error += "\n";
      error += stdErr;
      return false;
    }
  }

  // Return executable output on demand
  if (output != nullptr) {
    *output = stdOut;
  }

  // Register executable and output
  this->ExecutableTestOutputs_.emplace(executable, std::move(stdOut));

  return true;
}